

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  double *pdVar1;
  int LevelMin_00;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_34;
  abctime clk;
  int LevelMax;
  int LevelMin;
  Ivy_Obj_t *pNew_local;
  Ivy_Obj_t *pOld_local;
  Ivy_FraigMan_t *p_local;
  
  if ((pOld == (Ivy_Obj_t *)0x0) && (pNew == (Ivy_Obj_t *)0x0)) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0xa50,
                  "int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  aVar3 = Abc_Clock();
  veci_resize(&p->pSat->act_vars,0);
  Ivy_ManIncrementTravId(p->pManFraig);
  if ((0.0 < p->pParams->dActConeRatio) &&
     (pdVar1 = &p->pParams->dActConeRatio, *pdVar1 <= 1.0 && *pdVar1 != 1.0)) {
    if (pNew == (Ivy_Obj_t *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = *(uint *)&pNew->field_0x8 >> 0xb;
    }
    if (pOld == (Ivy_Obj_t *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = *(uint *)&pOld->field_0x8 >> 0xb;
    }
    if (local_3c < local_34) {
      if (pNew == (Ivy_Obj_t *)0x0) {
        local_40 = 0;
      }
      else {
        local_40 = *(uint *)&pNew->field_0x8 >> 0xb;
      }
      local_44 = local_40;
    }
    else {
      if (pOld == (Ivy_Obj_t *)0x0) {
        local_48 = 0;
      }
      else {
        local_48 = *(uint *)&pOld->field_0x8 >> 0xb;
      }
      local_44 = local_48;
    }
    LevelMin_00 = (int)((double)local_44 * (1.0 - p->pParams->dActConeRatio));
    if (pOld != (Ivy_Obj_t *)0x0) {
      iVar2 = Ivy_ObjIsConst1(pOld);
      if (iVar2 == 0) {
        Ivy_FraigSetActivityFactors_rec(p,pOld,LevelMin_00,local_44);
      }
    }
    if (pNew != (Ivy_Obj_t *)0x0) {
      iVar2 = Ivy_ObjIsConst1(pNew);
      if (iVar2 == 0) {
        Ivy_FraigSetActivityFactors_rec(p,pNew,LevelMin_00,local_44);
      }
    }
    aVar4 = Abc_Clock();
    p->timeTrav = (aVar4 - aVar3) + p->timeTrav;
    return 1;
  }
  __assert_fail("p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0xa57,"int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)"
               );
}

Assistant:

int Ivy_FraigSetActivityFactors( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{
    int LevelMin, LevelMax;
    abctime clk;
    assert( pOld || pNew );
clk = Abc_Clock(); 
    // reset the active variables
    veci_resize(&p->pSat->act_vars, 0);
    // prepare for traversal
    Ivy_ManIncrementTravId( p->pManFraig );
    // determine the min and max level to visit
    assert( p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1 );
    LevelMax = IVY_MAX( (pNew ? pNew->Level : 0), (pOld ? pOld->Level : 0) );
    LevelMin = (int)(LevelMax * (1.0 - p->pParams->dActConeRatio));
    // traverse
    if ( pOld && !Ivy_ObjIsConst1(pOld) )
        Ivy_FraigSetActivityFactors_rec( p, pOld, LevelMin, LevelMax );
    if ( pNew && !Ivy_ObjIsConst1(pNew) )
        Ivy_FraigSetActivityFactors_rec( p, pNew, LevelMin, LevelMax );
//Ivy_FraigPrintActivity( p );
p->timeTrav += Abc_Clock() - clk;
    return 1;
}